

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::CompositeInheritsRec
               (uint32_t depth,Layer *layer,PrimSpec *primspec,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  PrimMeta *pPVar3;
  value_type *pvVar4;
  size_type sVar5;
  string local_248 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  PrimSpec *local_208;
  PrimSpec *inheritPrimSpec;
  Path *inheritPath;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *inherits;
  ListEditQual *qual;
  PrimSpec *child;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  string *err_local;
  string *warn_local;
  PrimSpec *primspec_local;
  Layer *layer_local;
  uint32_t depth_local;
  
  if (0x100000 < depth) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositeInheritsRec");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3bc);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"Too deep.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&__range2);
      ::std::__cxx11::string::~string((string *)&__range2);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    return false;
  }
  this = PrimSpec::children(primspec);
  __end2._M_current =
       (PrimSpec *)std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin(this)
  ;
  child = (PrimSpec *)
          std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                     *)&child), bVar1) {
    qual = &__gnu_cxx::
            __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
            ::operator*(&__end2)->_specifier;
    bVar1 = CompositeInheritsRec(depth + 1,layer,(PrimSpec *)qual,warn,err);
    if (!bVar1) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
    ::operator++(&__end2);
  }
  pPVar3 = PrimSpec::metas(primspec);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&pPVar3->inherits);
  if (bVar1) {
    pPVar3 = PrimSpec::metas(primspec);
    inherits = (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
               ::value(&pPVar3->inherits);
    pPVar3 = PrimSpec::metas(primspec);
    pvVar4 = nonstd::optional_lite::
             optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
             ::value(&pPVar3->inherits);
    inheritPath = (Path *)&pvVar4->second;
    sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)inheritPath);
    if (sVar5 == 0) {
      pPVar3 = PrimSpec::metas(primspec);
      nonstd::optional_lite::
      optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
      ::reset(&pPVar3->inherits);
      return true;
    }
    sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)inheritPath);
    if (sVar5 != 1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Multiple inheritance is not supporetd.\n")
        ;
      }
      return false;
    }
    inheritPrimSpec =
         (PrimSpec *)
         ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                   ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)inheritPath,0);
    local_208 = (PrimSpec *)0x0;
    bVar1 = Layer::find_primspec_at(layer,(Path *)inheritPrimSpec,&local_208,err);
    if (!bVar1) {
      if (err != (string *)0x0) {
        Path::prim_part_abi_cxx11_((Path *)inheritPrimSpec);
        ::std::operator+((char *)local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Inheirt primspec failed since Path <");
        ::std::operator+(local_228,(char *)local_248);
        ::std::__cxx11::string::operator+=((string *)err,(string *)local_228);
        ::std::__cxx11::string::~string((string *)local_228);
        ::std::__cxx11::string::~string(local_248);
      }
      return false;
    }
    if (local_208 == (PrimSpec *)0x0) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)err,"Inernal error. PrimSpec is nullptr in CompositeInehritsRec.\n");
      }
      return false;
    }
    bVar1 = InheritPrimSpec(primspec,local_208,warn,err);
    if (!bVar1) {
      return false;
    }
    pPVar3 = PrimSpec::metas(primspec);
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
    ::reset(&pPVar3->inherits);
  }
  return true;
}

Assistant:

bool CompositeInheritsRec(uint32_t depth, const Layer &layer,
                          PrimSpec &primspec /* [inout] */, std::string *warn,
                          std::string *err) {
  if (depth > (1024 * 1024)) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeInheritsRec(depth + 1, layer, child, warn, err)) {
      return false;
    }
  }

  if (primspec.metas().inherits) {
    const auto &qual = primspec.metas().inherits.value().first;
    const auto &inherits = primspec.metas().inherits.value().second;

    if (inherits.size() == 0) {
      // no-op, just remove `inherits` metadataum.
      primspec.metas().inherits.reset();
      return true;
    }

    if (inherits.size() != 1) {
      if (err) {
        (*err) += "Multiple inheritance is not supporetd.\n";
      }
      return false;
    }

    const Path &inheritPath = inherits[0];

    const PrimSpec *inheritPrimSpec{nullptr};

    if (!layer.find_primspec_at(inheritPath, &inheritPrimSpec, err)) {
      if (err) {
        (*err) += "Inheirt primspec failed since Path <" +
                  inheritPath.prim_part() + "> not found or is invalid.\n";
      }

      return false;
    }

    // TODO: listEdit
    DCOUT("TODO: listEdit in `inherits`");
    (void)qual;

    if (inheritPrimSpec) {
      if (!InheritPrimSpec(primspec, *inheritPrimSpec, warn, err)) {
        return false;
      }

      // remove `inherits` metadataum.
      primspec.metas().inherits.reset();

    } else {
      // ???
      if (err) {
        (*err) +=
            "Inernal error. PrimSpec is nullptr in CompositeInehritsRec.\n";
      }
      return false;
    }
  }

  return true;
}